

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publications.cpp
# Opt level: O0

void __thiscall
helics::Publication::Publication
          (Publication *this,ValueFederate *valueFed,InterfaceHandle id,string_view key,
          string_view type,string_view units)

{
  string_view actName;
  string_view typeName;
  bool bVar1;
  DataType DVar2;
  precise_unit *utest;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  precise_unit pVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  precise_unit *__args;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  Interface *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  size_t in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  size_t in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  shared_ptr<units::precise_unit> local_88 [3];
  allocator<char> local_49 [33];
  undefined8 local_28;
  
  this_00 = (basic_string_view<char,_std::char_traits<char>_> *)&stack0x00000018;
  actName._M_str = in_stack_ffffffffffffff18;
  actName._M_len = in_stack_ffffffffffffff10;
  local_28 = in_RSI;
  Interface::Interface
            (in_stack_ffffffffffffff08,
             (Federate *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             (InterfaceHandle)(BaseType)((ulong)this_00 >> 0x20),actName);
  *in_RDI = &PTR__Publication_00a40190;
  in_RDI[7] = local_28;
  *(undefined4 *)(in_RDI + 8) = 0xffffffff;
  in_RDI[9] = 0;
  in_RDI[10] = 0xbff0000000000000;
  *(undefined4 *)(in_RDI + 0xb) = 0x62ae;
  *(undefined1 *)((long)in_RDI + 0x5c) = 0;
  *(undefined1 *)((long)in_RDI + 0x5d) = 0;
  in_RDI[0xc] = 0;
  __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0xd);
  std::
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  ::variant((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
             *)0x2c3375);
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x13);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (pbVar4,(basic_string_view<char,_std::char_traits<char>_> *)__str,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  std::allocator<char>::~allocator(local_49);
  __args = (precise_unit *)(in_RDI + 0x17);
  std::shared_ptr<units::precise_unit>::shared_ptr((shared_ptr<units::precise_unit> *)0x2c33d0);
  typeName._M_str = in_stack_ffffffffffffff68;
  typeName._M_len = in_stack_ffffffffffffff60;
  DVar2 = getTypeFromString(typeName);
  *(DataType *)(in_RDI + 0xb) = DVar2;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(this_00);
  if (!bVar1) {
    std::__cxx11::string::string(pbVar4,__str);
    ::units::getDefaultFlags();
    pVar3 = ::units::unit_from_string(pbVar4,(uint64_t)__str);
    utest = pVar3._8_8_;
    std::make_shared<units::precise_unit,units::precise_unit>(__args);
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x17);
    std::shared_ptr<units::precise_unit>::operator=
              ((shared_ptr<units::precise_unit> *)pbVar4,local_88);
    std::shared_ptr<units::precise_unit>::~shared_ptr((shared_ptr<units::precise_unit> *)0x2c34bd);
    std::__cxx11::string::~string(pbVar4);
    std::__shared_ptr_access<units::precise_unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<units::precise_unit,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              pbVar4);
    bVar1 = ::units::is_valid(utest);
    if (!bVar1) {
      std::__shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>::reset
                ((__shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2> *)utest);
    }
  }
  return;
}

Assistant:

Publication::Publication(ValueFederate* valueFed,
                         InterfaceHandle id,
                         std::string_view key,
                         std::string_view type,
                         std::string_view units):
    Interface(valueFed, id, key), fed(valueFed), pubUnits(units)
{
    pubType = getTypeFromString(type);
    if (!units.empty()) {
        pubUnitType = std::make_shared<units::precise_unit>(units::unit_from_string(pubUnits));
        if (!units::is_valid(*pubUnitType)) {
            pubUnitType.reset();
        }
    }
}